

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

int __thiscall METADemuxer::readPacket(METADemuxer *this,AVPacket *avPacket)

{
  pointer pSVar1;
  ContainerToReaderWrapper *this_00;
  _func_int **pp_Var2;
  int iVar3;
  long lVar4;
  ssize_t sVar5;
  bool bVar6;
  pointer pSVar7;
  iterator __begin4;
  AVPacket *pAVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int local_3c;
  
  avPacket->codec = (BaseAbstractStreamReader *)0x0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->stream_index = 0;
  this->m_lastReadRez = 0;
  lVar11 = 0x7fffffffffffffff;
  local_3c = -1;
  bVar6 = true;
  pAVar8 = avPacket;
  do {
    while (!bVar6) {
      if (local_3c != -1) {
        pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (this->m_flushDataMode == false) {
          pp_Var2 = ((pSVar7[local_3c].m_streamReader)->super_BaseAbstractStreamReader).
                    _vptr_BaseAbstractStreamReader;
          if (pSVar7[local_3c].lastReadRez == 3) {
            (*pp_Var2[7])();
            pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar7[local_3c].m_flushed = true;
          }
          else {
            iVar3 = (*pp_Var2[6])(pSVar7[local_3c].m_streamReader,avPacket);
            pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pSVar7[local_3c].m_lastAVRez = iVar3;
          }
          lVar11 = pSVar7[local_3c].m_timeShift;
          lVar9 = avPacket->dts + lVar11;
          avPacket->dts = lVar9;
          avPacket->pts = avPacket->pts + lVar11;
          pSVar7[local_3c].m_lastDTS = lVar9 + avPacket->duration;
        }
        else {
          (*((pSVar7[local_3c].m_streamReader)->super_BaseAbstractStreamReader).
            _vptr_BaseAbstractStreamReader[7])(pSVar7[local_3c].m_streamReader,avPacket);
          (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
          super__Vector_impl_data._M_start[local_3c].m_flushed = true;
        }
        updateReport(this,true);
        return 0;
      }
      if (this->m_flushDataMode != false) {
        updateReport(this,false);
        this->m_lastReadRez = 1;
        return 1;
      }
      this->m_flushDataMode = true;
      lVar11 = 0x7fffffffffffffff;
      local_3c = -1;
      bVar6 = true;
    }
    lVar10 = 0;
    lVar9 = 0;
    while( true ) {
      pSVar7 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar1 = (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pSVar1 - (long)pSVar7;
      if ((int)(lVar4 / 0x110) <= lVar9) break;
      if (this->m_flushDataMode == false) {
        sVar5 = StreamInfo::read((StreamInfo *)((long)&pSVar7->m_dataReader + lVar10),(int)pAVar8,
                                 (void *)(lVar4 % 0x110),0x110);
        iVar3 = (int)sVar5;
        *(int *)((long)&pSVar7->lastReadRez + lVar10) = iVar3;
        if (iVar3 == 3) goto LAB_001b1996;
        if (iVar3 != 4) {
          if (iVar3 == 2) {
            this->m_lastReadRez = 2;
            return 2;
          }
          lVar4 = *(long *)((long)&pSVar7->m_lastDTS + lVar10);
          if (lVar4 < lVar11) {
            lVar11 = lVar4;
            local_3c = (int)lVar9;
          }
          goto LAB_001b19b9;
        }
      }
      else {
LAB_001b1996:
        lVar4 = *(long *)((long)&pSVar7->m_lastDTS + lVar10);
        if ((lVar4 < lVar11) && ((&pSVar7->m_flushed)[lVar10] == false)) {
          lVar11 = lVar4;
          local_3c = (int)lVar9;
        }
LAB_001b19b9:
        bVar6 = false;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x110;
    }
    if (bVar6) {
      for (; pSVar7 != pSVar1; pSVar7 = pSVar7 + 1) {
        this_00 = (ContainerToReaderWrapper *)pSVar7->m_dataReader;
        if ((this_00 != (ContainerToReaderWrapper *)0x0) &&
           ((this_00->super_AbstractReader)._vptr_AbstractReader ==
            (_func_int **)&PTR__ContainerToReaderWrapper_0024b278)) {
          ContainerToReaderWrapper::resetDelayedMark(this_00);
        }
      }
    }
  } while( true );
}

Assistant:

int METADemuxer::readPacket(AVPacket& avPacket)

{
    avPacket.stream_index = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.codec = nullptr;
    m_lastReadRez = 0;
    while (true)
    {
        int minDtsIndex = -1;
        int64_t minDts = LLONG_MAX;
        bool allDataDelayed = true;
        while (allDataDelayed)
        {
            for (int i = 0; i < static_cast<int>(m_codecInfo.size()); i++)
            {
                StreamInfo& streamInfo = m_codecInfo[i];
                if (!m_flushDataMode)
                {
                    streamInfo.lastReadRez = streamInfo.read();
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_DELAYED)
                        continue;  // skip stream
                    allDataDelayed = false;
                    if (streamInfo.lastReadRez == BufferedFileReader::DATA_NOT_READY)
                    {
                        m_lastReadRez = BufferedFileReader::DATA_NOT_READY;
                        return BufferedFileReader::DATA_NOT_READY;
                    }
                    if (streamInfo.lastReadRez != BufferedFileReader::DATA_EOF2)
                    {
                        if (streamInfo.m_lastDTS < minDts)
                        {
                            minDtsIndex = i;
                            minDts = streamInfo.m_lastDTS;
                        }
                    }
                    else if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
                else
                {
                    allDataDelayed = false;
                    if (streamInfo.m_lastDTS < minDts && !streamInfo.m_flushed)
                    {
                        minDtsIndex = i;
                        minDts = streamInfo.m_lastDTS;
                    }
                }
            }
            if (allDataDelayed)
                for (const StreamInfo& si : m_codecInfo)
                {
                    const auto cReader = dynamic_cast<ContainerToReaderWrapper*>(si.m_dataReader);
                    if (cReader)
                        cReader->resetDelayedMark();
                }
        }
        if (minDtsIndex != -1)
        {
            if (!m_flushDataMode)
            {
                if (m_codecInfo[minDtsIndex].lastReadRez != BufferedFileReader::DATA_EOF2)
                {
                    const int res = m_codecInfo[minDtsIndex].m_streamReader->readPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_lastAVRez = res;
                }
                else
                {
                    // flush single stream
                    m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                    m_codecInfo[minDtsIndex].m_flushed = true;
                }
                // add time shift from external sync source
                // add static time shift
                avPacket.dts += m_codecInfo[minDtsIndex].m_timeShift;
                avPacket.pts += m_codecInfo[minDtsIndex].m_timeShift;
                m_codecInfo[minDtsIndex].m_lastDTS = avPacket.dts + avPacket.duration;
            }
            else
            {  // flush all streams
                m_codecInfo[minDtsIndex].m_streamReader->flushPacket(avPacket);
                m_codecInfo[minDtsIndex].m_flushed = true;
            }
            updateReport(true);
            return 0;
        }
        if (!m_flushDataMode)
            m_flushDataMode = true;
        else
        {
            updateReport(false);
            m_lastReadRez = BufferedFileReader::DATA_EOF;
            return BufferedReader::DATA_EOF;
        }
    }
}